

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<double>_>::MultAdd
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *x,
          TPZFMatrix<std::complex<double>_> *y,TPZFMatrix<std::complex<double>_> *z,
          complex<double> alpha,complex<double> beta,int opt)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  complex<double> beta_00;
  int iVar4;
  ulong uVar5;
  long lVar6;
  complex<double> *pcVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  ulong uVar15;
  undefined8 uVar16;
  int iVar17;
  ulong uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  complex<double> alpha_00;
  complex<double> alpha_01;
  complex<double> beta_01;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  uVar16 = alpha._M_value._8_8_;
  uVar14 = alpha._M_value._0_8_;
  alpha_00._M_value._0_4_ = alpha._M_value._0_4_;
  if (alpha_00._M_value._0_4_ == 0) {
    lVar6 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  }
  else {
    lVar6 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  }
  if (lVar6 != (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>",(char *)0x0);
  }
  lVar6 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if ((lVar6 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
     (lVar6 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  beta_01._M_value._4_4_ = 0;
  beta_01._M_value._0_4_ = alpha_00._M_value._0_4_;
  beta_01._M_value._8_8_ = uVar14;
  uVar14 = in_XMM3_Qa;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_01,(int)uVar16);
  uVar1 = *(uint *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c;
  uVar9 = (ulong)uVar1;
  if (uVar9 == 1) {
    alpha_00._M_value._4_4_ = 0;
    alpha_00._M_value._8_8_ = uVar16;
    MultAddScalar(this,x,y,z,alpha_00,beta,opt);
    return;
  }
  if (0 < (int)uVar1) {
    uVar5 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow / (long)uVar9;
    uVar15 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    lVar6 = (long)(int)((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol /
                       (long)uVar9);
    iVar13 = (int)uVar15;
    lVar8 = (long)iVar13;
    uVar9 = lVar6 * lVar8;
    iVar12 = (int)uVar5;
    uVar10 = iVar12 * lVar8;
    uVar5 = uVar5 & 0x7fffffff;
    uVar15 = uVar15 & 0x7fffffff;
    iVar17 = 0;
    do {
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_150.fSize = 0;
      local_150.fElem = (complex<double> *)0x0;
      local_150.fGiven = (complex<double> *)0x0;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar6;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar8;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_150.fWork.fNAlloc = 0;
      local_150.fWork.fStore = (complex<double> *)0x0;
      local_150.fWork.fNElements = 0;
      if (uVar9 != 0) {
        pcVar7 = (complex<double> *)operator_new__(-(ulong)(uVar9 >> 0x3c != 0) | uVar9 * 0x10);
        memset(pcVar7,0,uVar9 * 0x10);
        local_150.fElem = pcVar7;
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_c0.fElem = (complex<double> *)0x0;
      local_c0.fGiven = (complex<double> *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar12;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar8;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_c0.fWork.fStore = (complex<double> *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      if (uVar10 != 0) {
        pcVar7 = (complex<double> *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar10 * 0x10);
        memset(pcVar7,0,uVar10 * 0x10);
        local_c0.fElem = pcVar7;
      }
      if (0 < iVar12) {
        uVar18 = 0;
        do {
          if (0 < iVar13) {
            uVar11 = 0;
            do {
              (*(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])
                        (x,(long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                           super_TPZBaseMatrix.field_0x1c * (int)uVar18 + iVar17),
                         uVar11);
              uVar14 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              if ((local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <=
                   (long)uVar18) ||
                 (local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                  (long)uVar11)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(undefined8 *)
               local_150.fElem
               [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * uVar11 +
                uVar18]._M_value = uVar14;
              *(undefined8 *)
               ((long)local_150.fElem
                      [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                       uVar11 + uVar18]._M_value + 8) = in_XMM3_Qa;
              uVar11 = uVar11 + 1;
              in_XMM2_Qa = in_XMM3_Qa;
            } while (uVar15 != uVar11);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar5);
      }
      alpha_01._M_value._4_4_ = 0;
      alpha_01._M_value._0_4_ = alpha_00._M_value._0_4_;
      beta_00._M_value._8_8_ = x;
      beta_00._M_value._0_8_ = in_XMM2_Qa;
      alpha_01._M_value._8_8_ = uVar16;
      in_XMM3_Qa = in_XMM1_Qa;
      MultAddScalar(this,&local_150,&local_c0,&local_c0,alpha_01,beta_00,(int)uVar14);
      if (0 < iVar12) {
        uVar18 = 0;
        do {
          if (0 < iVar13) {
            uVar11 = 0;
            do {
              uVar14 = *(undefined8 *)
                        local_c0.fElem
                        [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                         uVar11 + uVar18]._M_value;
              uVar3 = *(undefined8 *)
                       ((long)local_c0.fElem
                              [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                               fRow * uVar11 + uVar18]._M_value + 8);
              iVar4 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c * (int)uVar18 + iVar17;
              if (((iVar4 < 0) ||
                  (lVar2 = (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
                  lVar2 <= iVar4)) ||
                 ((z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  (long)uVar11)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar7 = z->fElem;
              *(undefined8 *)pcVar7[lVar2 * uVar11 + (long)iVar4]._M_value = uVar14;
              *(undefined8 *)(pcVar7[lVar2 * uVar11 + (long)iVar4]._M_value + 8) = uVar3;
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar5);
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
      iVar17 = iVar17 + 1;
    } while (iVar17 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c);
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                      TVar alpha, TVar beta, int opt) const{
    // multiplies the transfer matrix and puts the result in z
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows()))
        this->Error( "TPZTransfer<TVar>::MultAdd <matrices with incompatible dimensions>" );
    if(x.Cols() != y.Cols() || x.Cols() != z.Cols()) {
        this->Error ("TPZTransfer<TVar>::MultiplyAdd incompatible dimensions\n");
    }
    int rows = fRowBlock.MaxBlockSize();
    int xcols = x.Cols();
    int ic, c, r;
    this->PrepareZ(y,z,beta,opt);
    if (fNTVarVar == 1) {
        MultAddScalar(x, y, z, alpha, beta, opt);
    }
    else
    {
        int nrc = x.Rows();
        int ncc = x.Cols();
        int thisr = this->Rows()/fNTVarVar;
        int thisc = this->Cols()/fNTVarVar;
        for(int iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncc);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    tempcoarse(i,c) = x.GetVal(iv+i*fNTVarVar,c);
                }
            }
            MultAddScalar(tempcoarse, tempfine, tempfine, alpha, 0., opt);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncc; c++) {
                    z(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                }
            }
        }
    }
}